

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

void arrangeQuoters_superFast_lessThen5
               (word *pInOut,int start,int iQ,int jQ,int kQ,int lQ,int iVar,int nWords,
               char *pCanonPerm,uint *pCanonPhase)

{
  ulong uVar1;
  uint __line;
  byte bVar2;
  int iVar3;
  char *__assertion;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  bVar2 = (byte)iVar;
  iVar5 = iQ << (bVar2 & 0x1f);
  iVar4 = jQ << (bVar2 & 0x1f);
  iVar3 = kQ << (bVar2 & 0x1f);
  iVar6 = lQ << (bVar2 & 0x1f);
  iVar7 = 3 << (bVar2 & 0x1f);
  while( true ) {
    if (start < 0) {
      updataInfo(iQ,jQ,iVar,pCanonPerm,pCanonPhase);
      return;
    }
    if (0x3f < iVar5) break;
    if (0x3f < iVar4) {
      __assertion = "jQ*blockSize < 64";
      __line = 0x6d;
      goto LAB_004d530e;
    }
    if (0x3f < iVar3) {
      __assertion = "kQ*blockSize < 64";
      __line = 0x6e;
      goto LAB_004d530e;
    }
    if (0x3f < iVar6) {
      __assertion = "lQ*blockSize < 64";
      __line = 0x6f;
      goto LAB_004d530e;
    }
    if (0x3f < iVar7) {
      __assertion = "3*blockSize < 64";
      __line = 0x70;
      goto LAB_004d530e;
    }
    uVar1 = pInOut[(uint)start];
    pInOut[(uint)start] =
         ((uVar1 & SFmask[iVar][lQ]) << ((byte)iVar6 & 0x3f)) >> ((byte)iVar7 & 0x3f) |
         ((SFmask[iVar][kQ] & uVar1) << ((byte)iVar3 & 0x3f)) >>
         ((byte)(2 << (bVar2 & 0x1f)) & 0x3f) |
         ((SFmask[iVar][jQ] & uVar1) << ((byte)iVar4 & 0x3f)) >>
         ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) | (SFmask[iVar][iQ] & uVar1) << ((byte)iVar5 & 0x3f);
    start = start - 1;
  }
  __assertion = "iQ*blockSize < 64";
  __line = 0x6c;
LAB_004d530e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                ,__line,
                "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
               );
}

Assistant:

void arrangeQuoters_superFast_lessThen5(word* pInOut, int start, int iQ, int jQ, int kQ, int lQ, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i, blockSize = 1<<iVar;
//     printf("in arrangeQuoters_superFast_lessThen5\n");
//     printf("start = %d, iQ = %d,jQ = %d,kQ = %d,lQ = %d, iVar = %d, nWords = %d\n", start, iQ, jQ, kQ , lQ, iVar, nWords);
    for(i=start;i>=0;i--)
    {   
        assert( iQ*blockSize < 64 );
        assert( jQ*blockSize < 64 );
        assert( kQ*blockSize < 64 );
        assert( lQ*blockSize < 64 );
        assert( 3*blockSize < 64 );
        pInOut[i] = (pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize) |
            (((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize))>>blockSize) |
            (((pInOut[i] & SFmask[iVar][kQ])<<(kQ*blockSize))>>2*blockSize) |
            (((pInOut[i] & SFmask[iVar][lQ])<<(lQ*blockSize))>>3*blockSize);
    }
    updataInfo(iQ, jQ, iVar, pCanonPerm, pCanonPhase);
//     printf("out arrangeQuoters_superFast_lessThen5\n");

}